

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFLTKWrapUICommand.cxx
# Opt level: O1

bool cmFLTKWrapUICommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this;
  pointer pcVar2;
  _Head_base<0UL,_cmCustomCommand_*,_false> _Var3;
  undefined8 uVar4;
  bool bVar5;
  string *psVar6;
  string *psVar7;
  cmSourceFile *this_00;
  cmCustomCommand *this_01;
  string *psVar8;
  long lVar9;
  undefined8 uVar10;
  long lVar11;
  ulong uVar12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  string_view value;
  __single_object hcc;
  string sourceListValue;
  __single_object ccc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputDirectories;
  string outName;
  string cxxres;
  string varName;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> generatedSourcesClasses;
  string cdir;
  string outputDirectory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmCustomCommandLines commandLines;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_278;
  string local_270;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_250;
  _Any_data local_248;
  code *local_238;
  code *pcStack_230;
  undefined1 local_228 [16];
  code *local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_210;
  __uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_208;
  char *local_200;
  long local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  size_type local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  string local_198;
  void *local_178;
  iterator iStack_170;
  cmSourceFile **local_168;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_160;
  __uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_158;
  string *local_150;
  void *local_148;
  code *local_140 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  pointer local_110;
  string local_108;
  string local_e8;
  string local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  ulong local_88;
  pointer local_80;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_78;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  uVar12 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  if (uVar12 < 0x21) {
    local_248._M_unused._M_object = (string *)&local_238;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_248,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_140[0] = local_238;
    uVar10 = local_248._M_unused._0_8_;
    if ((string *)local_248._M_unused._0_8_ == (string *)&local_238) goto LAB_0024cc5b;
  }
  else {
    this = status->Makefile;
    local_88 = uVar12;
    psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
    local_150 = (string *)local_140;
    pcVar2 = (psVar6->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar2,pcVar2 + psVar6->_M_string_length);
    local_248._M_unused._M_object = &local_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"FLTK_FLUID_EXECUTABLE","")
    ;
    psVar6 = cmMakefile::GetRequiredDefinition(this,(string *)&local_248);
    if ((code **)local_248._M_unused._0_8_ != &local_238) {
      operator_delete(local_248._M_unused._M_object,(ulong)(local_238 + 1));
    }
    local_110 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
    local_130._M_allocated_capacity = (size_type)&local_120;
    pcVar2 = (psVar7->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar2,pcVar2 + psVar7->_M_string_length);
    local_248._M_unused._M_object = (cmSourceFile *)0x0;
    local_248._8_8_ = 0;
    local_238 = (code *)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_248,(value_type *)&local_130);
    cmMakefile::AddIncludeDirectories
              (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_248,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_248);
    local_178 = (void *)0x0;
    iStack_170._M_current = (cmSourceFile **)0x0;
    local_168 = (cmSourceFile **)0x0;
    local_80 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    psVar7 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1;
    if (psVar7 != local_80) {
      do {
        this_00 = cmMakefile::GetSource(this,psVar7,Ambiguous);
        if (this_00 == (cmSourceFile *)0x0) {
          bVar5 = true;
        }
        else {
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"WRAP_EXCLUDE","");
          bVar5 = cmSourceFile::GetPropertyAsBool(this_00,&local_c8);
          bVar5 = !bVar5;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
        }
        uVar4 = local_130._8_8_;
        uVar10 = local_130._M_allocated_capacity;
        if (bVar5) {
          cmsys::SystemTools::GetFilenameWithoutExtension(&local_270,psVar7);
          local_248._M_unused._M_object = (void *)uVar4;
          local_248._8_8_ = uVar10;
          local_238 = (code *)0x1;
          pcStack_230 = (code *)0x816162;
          local_228._0_8_ = local_270._M_string_length;
          local_228._8_8_ = local_270._M_dataplus._M_p;
          views._M_len = 3;
          views._M_array = (iterator)&local_248;
          cmCatViews_abi_cxx11_((string *)local_1d8,views);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,
                            CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                                     local_270.field_2._M_local_buf[0]) + 1);
          }
          local_248._M_unused._M_object = (void *)local_1d8._8_8_;
          local_248._8_8_ = local_1d8._0_8_;
          local_238 = (code *)0x2;
          pcStack_230 = (code *)0x7d6e00;
          views_00._M_len = 2;
          views_00._M_array = (iterator)&local_248;
          cmCatViews_abi_cxx11_(&local_270,views_00);
          local_248._M_unused._M_object = local_148;
          local_248._8_8_ = local_150;
          local_238 = (code *)0x1;
          pcStack_230 = (code *)0x816162;
          local_228._8_8_ = (psVar7->_M_dataplus)._M_p;
          local_228._0_8_ = psVar7->_M_string_length;
          views_01._M_len = 3;
          views_01._M_array = (iterator)&local_248;
          cmCatViews_abi_cxx11_(&local_198,views_01);
          local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_a8,&local_198);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_a8,psVar6);
          local_248._M_unused._M_object = (void *)local_1d8._8_8_;
          local_248._8_8_ = local_1d8._0_8_;
          local_238 = (code *)0x4;
          pcStack_230 = (code *)0x7df02d;
          views_02._M_len = 2;
          views_02._M_array = (iterator)&local_248;
          cmCatViews_abi_cxx11_((string *)&local_1b8,views_02);
          local_248._8_8_ = (psVar6->_M_dataplus)._M_p;
          local_248._M_unused._0_8_ = (undefined8)psVar6->_M_string_length;
          local_238 = (code *)0x2;
          pcStack_230 = (code *)0x7fd1af;
          local_228._0_8_ = &DAT_00000002;
          local_228._8_8_ = "-h";
          local_218 = (code *)local_270._M_string_length;
          paStack_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_270._M_dataplus._M_p;
          local_208._M_t.
          super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
          super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
               (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
               (_Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)0x2;
          local_200 = "-o";
          local_1f8 = local_1b8._8_8_;
          local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b8._M_allocated_capacity;
          local_1e8 = local_198._M_string_length;
          local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_198._M_dataplus._M_p;
          ilist._M_len = 7;
          ilist._M_array = (iterator)&local_248;
          cmMakeSingleCommandLine((cmCustomCommandLines *)&local_78,ilist);
          std::make_unique<cmCustomCommand>();
          _Var3._M_head_impl = local_278._M_head_impl;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_48,&local_a8);
          cmCustomCommand::SetDepends(_Var3._M_head_impl,&local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          _Var3._M_head_impl = local_278._M_head_impl;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                    (&local_60,&local_78);
          cmCustomCommand::SetCommandLines(_Var3._M_head_impl,(cmCustomCommandLines *)&local_60);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_60)
          ;
          _Var3._M_head_impl = local_278._M_head_impl;
          this_01 = (cmCustomCommand *)operator_new(0x138);
          cmCustomCommand::cmCustomCommand(this_01,_Var3._M_head_impl);
          _Var3._M_head_impl = local_278._M_head_impl;
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          local_250._M_head_impl = this_01;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,local_1b8._M_allocated_capacity,
                     local_1b8._8_8_ + local_1b8._M_allocated_capacity);
          cmCustomCommand::SetOutputs(_Var3._M_head_impl,&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          local_158._M_t.
          super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
          super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
               (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
               (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
               local_278._M_head_impl;
          local_278._M_head_impl = (cmCustomCommand *)0x0;
          local_238 = (code *)0x0;
          pcStack_230 = (code *)0x0;
          local_248._M_unused._M_object = (void *)0x0;
          local_248._8_8_ = 0;
          cmMakefile::AddCustomCommandToOutput
                    (this,(unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                          &local_158,(CommandSourceCallback *)&local_248,false);
          if (local_238 != (code *)0x0) {
            (*local_238)(&local_248,&local_248,3);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_158);
          _Var3._M_head_impl = local_250._M_head_impl;
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_108,local_270._M_dataplus._M_p,
                     (code *)(local_270._M_string_length + (long)local_270._M_dataplus._M_p));
          cmCustomCommand::SetOutputs(_Var3._M_head_impl,&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          local_160._M_head_impl = local_250._M_head_impl;
          local_250._M_head_impl = (cmCustomCommand *)0x0;
          local_238 = (code *)0x0;
          pcStack_230 = (code *)0x0;
          local_248._M_unused._M_object = (void *)0x0;
          local_248._8_8_ = 0;
          cmMakefile::AddCustomCommandToOutput
                    (this,(unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                          &local_160,(CommandSourceCallback *)&local_248,false);
          if (local_238 != (code *)0x0) {
            (*local_238)(&local_248,&local_248,3);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_160);
          local_248._M_unused._M_object = cmMakefile::GetSource(this,(string *)&local_1b8,Ambiguous)
          ;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&((cmSourceFile *)local_248._M_unused._0_8_)->Depends,&local_270);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_248._M_unused._M_function_pointer + 0x110),&local_198);
          if (iStack_170._M_current == local_168) {
            std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
            _M_realloc_insert<cmSourceFile*const&>
                      ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)&local_178,iStack_170,
                       (cmSourceFile **)&local_248);
          }
          else {
            *iStack_170._M_current = (cmSourceFile *)local_248._M_unused._0_8_;
            iStack_170._M_current = iStack_170._M_current + 1;
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_250);
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_278);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_78)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_allocated_capacity != &local_1a8) {
            operator_delete((void *)local_1b8._M_allocated_capacity,
                            local_1a8._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,
                            CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                                     local_270.field_2._M_local_buf[0]) + 1);
          }
          if ((string *)local_1d8._0_8_ != (string *)(local_1d8 + 0x10)) {
            operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8._M_allocated_capacity + 1));
          }
        }
        psVar7 = psVar7 + 1;
      } while (psVar7 != local_80);
    }
    paVar1 = &local_270.field_2;
    local_270._M_string_length = 0;
    local_270.field_2._M_local_buf[0] = '\0';
    local_270._M_dataplus._M_p = (pointer)paVar1;
    if ((long)iStack_170._M_current - (long)local_178 != 0) {
      lVar11 = (long)iStack_170._M_current - (long)local_178 >> 3;
      lVar9 = 0;
      do {
        if (lVar9 != 0) {
          std::__cxx11::string::append((char *)&local_270);
        }
        psVar6 = cmSourceFile::ResolveFullPath
                           (*(cmSourceFile **)((long)local_178 + lVar9 * 8),(string *)0x0,
                            (string *)0x0);
        std::__cxx11::string::_M_append((char *)&local_270,(ulong)(psVar6->_M_dataplus)._M_p);
        lVar9 = lVar9 + 1;
      } while (lVar11 + (ulong)(lVar11 == 0) != lVar9);
    }
    pcVar2 = (local_110->_M_dataplus)._M_p;
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,pcVar2,pcVar2 + local_110->_M_string_length);
    std::__cxx11::string::append((char *)&local_198);
    value._M_str = local_270._M_dataplus._M_p;
    value._M_len = local_270._M_string_length;
    cmMakefile::AddDefinition(this,&local_198,value);
    pcVar2 = (local_110->_M_dataplus)._M_p;
    local_1b8._M_allocated_capacity = (size_type)&local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,pcVar2,pcVar2 + local_110->_M_string_length);
    local_1c8._M_allocated_capacity = 0;
    local_1c8._8_8_ = 0;
    local_1d8._0_8_ = (pointer)0x0;
    local_1d8._8_8_ = (void *)0x0;
    psVar8 = (string *)operator_new(0x20);
    *(string **)&psVar8->field_0x0 = psVar8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              (psVar8,local_1b8._M_allocated_capacity,
               local_1b8._8_8_ + local_1b8._M_allocated_capacity);
    pcStack_230 = std::
                  _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFLTKWrapUICommand.cxx:134:5)>
                  ::_M_invoke;
    local_248._8_8_ = local_1d8._8_8_;
    local_238 = std::
                _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFLTKWrapUICommand.cxx:134:5)>
                ::_M_manager;
    local_1c8._M_allocated_capacity = 0;
    local_1c8._8_8_ = 0;
    local_218 = (code *)0x0;
    paStack_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
    local_228._0_8_ = (undefined1 *)0x0;
    local_228._8_8_ = (char *)0x0;
    local_208._M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
         (_Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)0x0;
    local_248._M_unused._0_8_ = (undefined8)psVar8;
    local_1d8._0_8_ = psVar8;
    cmMakefile::AddGeneratorAction(this,(GeneratorAction *)&local_248);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_208);
    if (local_218 != (code *)0x0) {
      (*local_218)((_Any_data *)local_228,(_Any_data *)local_228,__destroy_functor);
    }
    if (local_238 != (code *)0x0) {
      (*local_238)(&local_248,&local_248,3);
    }
    if ((code *)local_1c8._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_1c8._M_allocated_capacity)(local_1d8,local_1d8,3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_allocated_capacity != &local_1a8) {
      operator_delete((void *)local_1b8._M_allocated_capacity,local_1a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    uVar12 = local_88;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != paVar1) {
      operator_delete(local_270._M_dataplus._M_p,
                      CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                               local_270.field_2._M_local_buf[0]) + 1);
    }
    if (local_178 != (void *)0x0) {
      operator_delete(local_178,(long)local_168 - (long)local_178);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_allocated_capacity != &local_120) {
      operator_delete((void *)local_130._M_allocated_capacity,local_120._M_allocated_capacity + 1);
    }
    uVar10 = local_150;
    if (local_150 == (string *)local_140) goto LAB_0024cc5b;
  }
  operator_delete((void *)uVar10,(ulong)(local_140[0] + 1));
LAB_0024cc5b:
  return 0x20 < uVar12;
}

Assistant:

bool cmFLTKWrapUICommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // what is the current source dir
  std::string cdir = mf.GetCurrentSourceDirectory();
  std::string const& fluid_exe =
    mf.GetRequiredDefinition("FLTK_FLUID_EXECUTABLE");

  // Target that will use the generated files
  std::string const& target = args[0];

  // get the list of GUI files from which .cxx and .h will be generated
  std::string outputDirectory = mf.GetCurrentBinaryDirectory();

  {
    // Some of the generated files are *.h so the directory "GUI"
    // where they are created have to be added to the include path
    std::vector<std::string> outputDirectories;
    outputDirectories.push_back(outputDirectory);
    mf.AddIncludeDirectories(outputDirectories);
  }

  // List of produced files.
  std::vector<cmSourceFile*> generatedSourcesClasses;

  for (std::string const& arg : cmMakeRange(args).advance(1)) {
    cmSourceFile* curr = mf.GetSource(arg);
    // if we should use the source GUI
    // to generate .cxx and .h files
    if (!curr || !curr->GetPropertyAsBool("WRAP_EXCLUDE")) {
      std::string outName = cmStrCat(
        outputDirectory, "/", cmSystemTools::GetFilenameWithoutExtension(arg));
      std::string hname = cmStrCat(outName, ".h");
      std::string origname = cmStrCat(cdir, "/", arg);
      // add starting depends
      std::vector<std::string> depends;
      depends.push_back(origname);
      depends.push_back(fluid_exe);
      std::string cxxres = cmStrCat(outName, ".cxx");

      cmCustomCommandLines commandLines = cmMakeSingleCommandLine({
        fluid_exe,
        "-c", // instructs Fluid to run in command line
        "-h", // optionally rename .h files
        hname,
        "-o", // optionally rename .cxx files
        cxxres,
        origname // name of the GUI fluid file
      });

      // Add command for generating the .h and .cxx files

      auto hcc = cm::make_unique<cmCustomCommand>();
      hcc->SetDepends(depends);
      hcc->SetCommandLines(commandLines);
      auto ccc = cm::make_unique<cmCustomCommand>(*hcc);

      hcc->SetOutputs(cxxres);
      mf.AddCustomCommandToOutput(std::move(hcc));

      ccc->SetOutputs(hname);
      mf.AddCustomCommandToOutput(std::move(ccc));

      cmSourceFile* sf = mf.GetSource(cxxres);
      sf->AddDepend(hname);
      sf->AddDepend(origname);
      generatedSourcesClasses.push_back(sf);
    }
  }

  // create the variable with the list of sources in it
  size_t lastHeadersClass = generatedSourcesClasses.size();
  std::string sourceListValue;
  for (size_t classNum = 0; classNum < lastHeadersClass; classNum++) {
    if (classNum) {
      sourceListValue += ";";
    }
    sourceListValue += generatedSourcesClasses[classNum]->ResolveFullPath();
  }

  std::string const varName = target + "_FLTK_UI_SRCS";
  mf.AddDefinition(varName, sourceListValue);

  mf.AddGeneratorAction(
    [target](cmLocalGenerator& lg, const cmListFileBacktrace& lfbt) {
      FinalAction(*lg.GetMakefile(), target, lfbt);
    });
  return true;
}